

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall slang::ast::TypePrinter::TypePrinter(TypePrinter *this)

{
  FormatBuffer *__s;
  
  (this->options).anonymousTypeStyle = SystemName;
  (this->options).addSingleQuotes = false;
  (this->options).elideScopeNames = false;
  (this->options).printAKA = false;
  (this->options).skipScopedTypeNames = false;
  (this->options).skipTypeDefs = false;
  (this->options).fullEnumType = false;
  __s = (FormatBuffer *)operator_new(0x220);
  memset(__s,0,0x220);
  *(code **)((long)&(__s->buf).super_buffer<char> + 0x18) =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  (__s->buf).super_buffer<char>.ptr_ = (__s->buf).store_;
  *(size_t *)((long)&(__s->buf).super_buffer<char> + 0x10) = 500;
  __s->showColors = false;
  (this->buffer)._M_t.
  super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
  super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
  super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl = __s;
  return;
}

Assistant:

TypePrinter::TypePrinter() : buffer(std::make_unique<FormatBuffer>()) {
}